

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isEquivalentBaseUnitNotInModel_Test::TestBody(Units_isEquivalentBaseUnitNotInModel_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  char *local_a0 [4];
  allocator<char> local_80 [8];
  allocator<char> local_78 [8];
  UnitsPtr u2;
  AssertionResult gtest_ar_;
  UnitsPtr u1;
  ModelPtr model;
  UnitsPtr u;
  
  libcellml::Model::create();
  peVar2 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"model",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Units::create();
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"apples",(allocator<char> *)&u1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",(allocator<char> *)&u2)
  ;
  libcellml::Units::addUnit
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (int)local_a0,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Units::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u1",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((StandardUnit)
             u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x16,1.0,1.0
             ,(string *)0x0);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u2",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit((StandardUnit)peVar1,0x16,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"u",local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (int)local_a0,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar3 = libcellml::Units::compatible((shared_ptr *)&u1,(shared_ptr *)&u2);
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,
               "libcellml::Units::compatible(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x799,local_a0[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar3 = libcellml::Units::compatible((shared_ptr *)&u2,(shared_ptr *)&u1);
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,
               "libcellml::Units::compatible(u2, u1)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x79a,local_a0[0]);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, isEquivalentBaseUnitNotInModel)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);
    // u1 compatible to u2 test should fail because base unit "u" is not present in u1, regardless of whether "apples" exists or not

    model->addUnits(u1);
    model->addUnits(u2);

    // Units "u" not in model.  Units "apples" doesn't exist.  Units are not linked.
    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}